

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O0

void Rml::Detail::ShutdownElementInstancerPools(void)

{
  bool bVar1;
  ElementInstancerPools *this;
  
  this = ControlledLifetimeResource<Rml::ElementInstancerPools>::operator->
                   ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)
                    element_instancer_pools);
  bVar1 = ElementInstancerPools::IsEmpty(this);
  if (bVar1) {
    ControlledLifetimeResource<Rml::ElementInstancerPools>::Shutdown
              ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)element_instancer_pools);
  }
  else {
    ControlledLifetimeResource<Rml::ElementInstancerPools>::Leak
              ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)element_instancer_pools);
  }
  return;
}

Assistant:

void Detail::ShutdownElementInstancerPools()
{
	if (element_instancer_pools->IsEmpty())
		element_instancer_pools.Shutdown();
	else
		element_instancer_pools.Leak();
}